

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-getaddrinfo.c
# Opt level: O2

int run_benchmark_getaddrinfo(void)

{
  int iVar1;
  uint64_t uVar2;
  uv_loop_t *puVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uStack_20;
  
  loop = uv_default_loop();
  uv_update_time(loop);
  start_time = uv_now(loop);
  for (lVar4 = 0; lVar4 != 0x640; lVar4 = lVar4 + 0xa0) {
    getaddrinfo_initiate((uv_getaddrinfo_t *)((long)handles[0].reserved + lVar4 + -0x10));
  }
  uv_run(loop,UV_RUN_DEFAULT);
  uv_update_time(loop);
  uVar2 = uv_now(loop);
  if (calls_initiated == 10000) {
    if (calls_completed == 10000) {
      fprintf(_stderr,"getaddrinfo: %.0f req/s\n",
              (10000.0 / (double)(long)(uVar2 - start_time)) * 1000.0);
      fflush(_stderr);
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar5 = "0 == uv_loop_close(uv_default_loop())";
      uStack_20 = 0x5a;
    }
    else {
      pcVar5 = "calls_completed == TOTAL_CALLS";
      uStack_20 = 0x54;
    }
  }
  else {
    pcVar5 = "calls_initiated == TOTAL_CALLS";
    uStack_20 = 0x53;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-getaddrinfo.c"
          ,uStack_20,pcVar5);
  abort();
}

Assistant:

BENCHMARK_IMPL(getaddrinfo) {
  int i;

  loop = uv_default_loop();

  uv_update_time(loop);
  start_time = uv_now(loop);

  for (i = 0; i < CONCURRENT_CALLS; i++) {
    getaddrinfo_initiate(&handles[i]);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  uv_update_time(loop);
  end_time = uv_now(loop);

  ASSERT(calls_initiated == TOTAL_CALLS);
  ASSERT(calls_completed == TOTAL_CALLS);

  fprintf(stderr, "getaddrinfo: %.0f req/s\n",
          (double) calls_completed / (double) (end_time - start_time) * 1000.0);
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}